

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

Node * __thiscall wasm::DataFlow::Graph::visitExpression(Graph *this,Expression *curr)

{
  bool bVar1;
  Node *pNVar2;
  Fatal local_210;
  Drop *local_88;
  Drop *drop;
  Unreachable *unreachable;
  Select *select;
  Binary *binary;
  Unary *unary;
  Const *c;
  Switch *sw;
  Break *br;
  LocalSet *set;
  LocalGet *get;
  Loop *loop;
  If *iff;
  Block *block;
  Expression *curr_local;
  Graph *this_local;
  
  block = (Block *)curr;
  curr_local = (Expression *)this;
  iff = (If *)Expression::dynCast<wasm::Block>(curr);
  if ((Block *)iff == (Block *)0x0) {
    loop = (Loop *)Expression::dynCast<wasm::If>((Expression *)block);
    if ((If *)loop == (If *)0x0) {
      get = (LocalGet *)Expression::dynCast<wasm::Loop>((Expression *)block);
      if ((Loop *)get == (Loop *)0x0) {
        set = (LocalSet *)Expression::dynCast<wasm::LocalGet>((Expression *)block);
        if (set == (LocalSet *)0x0) {
          br = (Break *)Expression::dynCast<wasm::LocalSet>((Expression *)block);
          if (br == (Break *)0x0) {
            sw = (Switch *)Expression::dynCast<wasm::Break>((Expression *)block);
            if (sw == (Switch *)0x0) {
              c = (Const *)Expression::dynCast<wasm::Switch>((Expression *)block);
              if ((Switch *)c == (Switch *)0x0) {
                unary = (Unary *)Expression::dynCast<wasm::Const>((Expression *)block);
                if ((Const *)unary == (Const *)0x0) {
                  binary = (Binary *)Expression::dynCast<wasm::Unary>((Expression *)block);
                  if (binary == (Binary *)0x0) {
                    select = (Select *)Expression::dynCast<wasm::Binary>((Expression *)block);
                    if ((Binary *)select == (Binary *)0x0) {
                      unreachable = (Unreachable *)
                                    Expression::dynCast<wasm::Select>((Expression *)block);
                      if ((Select *)unreachable == (Select *)0x0) {
                        drop = (Drop *)Expression::dynCast<wasm::Unreachable>((Expression *)block);
                        if (drop == (Drop *)0x0) {
                          local_88 = Expression::dynCast<wasm::Drop>((Expression *)block);
                          if (local_88 == (Drop *)0x0) {
                            bVar1 = Expression::is<wasm::Try>((Expression *)block);
                            if (((!bVar1) &&
                                (bVar1 = Expression::is<wasm::Throw>((Expression *)block), !bVar1))
                               && (bVar1 = Expression::is<wasm::Rethrow>((Expression *)block),
                                  !bVar1)) {
                              pNVar2 = doVisitGeneric(this,(Expression *)block);
                              return pNVar2;
                            }
                            Fatal::Fatal(&local_210);
                            Fatal::operator<<(&local_210,
                                              (char (*) [46])
                                              "DataFlow does not support EH instructions yet");
                            Fatal::~Fatal(&local_210);
                          }
                          this_local = (Graph *)doVisitDrop(this,local_88);
                        }
                        else {
                          this_local = (Graph *)doVisitUnreachable(this,(Unreachable *)drop);
                        }
                      }
                      else {
                        this_local = (Graph *)doVisitSelect(this,(Select *)unreachable);
                      }
                    }
                    else {
                      this_local = (Graph *)doVisitBinary(this,(Binary *)select);
                    }
                  }
                  else {
                    this_local = (Graph *)doVisitUnary(this,(Unary *)binary);
                  }
                }
                else {
                  this_local = (Graph *)doVisitConst(this,(Const *)unary);
                }
              }
              else {
                this_local = (Graph *)doVisitSwitch(this,(Switch *)c);
              }
            }
            else {
              this_local = (Graph *)doVisitBreak(this,(Break *)sw);
            }
          }
          else {
            this_local = (Graph *)doVisitLocalSet(this,(LocalSet *)br);
          }
        }
        else {
          this_local = (Graph *)doVisitLocalGet(this,(LocalGet *)set);
        }
      }
      else {
        this_local = (Graph *)doVisitLoop(this,(Loop *)get);
      }
    }
    else {
      this_local = (Graph *)doVisitIf(this,(If *)loop);
    }
  }
  else {
    this_local = (Graph *)doVisitBlock(this,(Block *)iff);
  }
  return &this_local->bad;
}

Assistant:

Node* visitExpression(Expression* curr) {
    // TODO Exception handling instruction support

    // Control flow and get/set etc. are special. Aside from them, we just need
    // to do something very generic.
    if (auto* block = curr->dynCast<Block>()) {
      return doVisitBlock(block);
    } else if (auto* iff = curr->dynCast<If>()) {
      return doVisitIf(iff);
    } else if (auto* loop = curr->dynCast<Loop>()) {
      return doVisitLoop(loop);
    } else if (auto* get = curr->dynCast<LocalGet>()) {
      return doVisitLocalGet(get);
    } else if (auto* set = curr->dynCast<LocalSet>()) {
      return doVisitLocalSet(set);
    } else if (auto* br = curr->dynCast<Break>()) {
      return doVisitBreak(br);
    } else if (auto* sw = curr->dynCast<Switch>()) {
      return doVisitSwitch(sw);
    } else if (auto* c = curr->dynCast<Const>()) {
      return doVisitConst(c);
    } else if (auto* unary = curr->dynCast<Unary>()) {
      return doVisitUnary(unary);
    } else if (auto* binary = curr->dynCast<Binary>()) {
      return doVisitBinary(binary);
    } else if (auto* select = curr->dynCast<Select>()) {
      return doVisitSelect(select);
    } else if (auto* unreachable = curr->dynCast<Unreachable>()) {
      return doVisitUnreachable(unreachable);
    } else if (auto* drop = curr->dynCast<Drop>()) {
      return doVisitDrop(drop);
    } else if (curr->is<Try>() || curr->is<Throw>() || curr->is<Rethrow>()) {
      Fatal() << "DataFlow does not support EH instructions yet";
    } else {
      return doVisitGeneric(curr);
    }
  }